

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

void __thiscall SQLexer::LexLineComment(SQLexer *this)

{
  bool bVar1;
  SQLexer *this_local;
  
  do {
    Next(this);
    this->_currentcolumn = this->_currentcolumn + 1;
    bVar1 = false;
    if (this->_currdata != '\n') {
      bVar1 = this->_currdata != '\0';
    }
  } while (bVar1);
  return;
}

Assistant:

void SQLexer::LexLineComment()
{
    do { NEXT(); } while (CUR_CHAR != _SC('\n') && (!IS_EOB()));
}